

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void dns_handler(mg_connection *nc,int ev,void *ev_data)

{
  int iVar1;
  uint16_t local_c4a;
  undefined1 local_c48 [6];
  uint16_t len;
  mg_dns_message msg;
  mbuf *io;
  void *ev_data_local;
  int ev_local;
  mg_connection *nc_local;
  
  msg.answers[0x1f].rdata.len = (size_t)&nc->recv_mbuf;
  (*nc->handler)(nc,ev,ev_data);
  if (ev == 3) {
    if ((nc->flags & 2) == 0) {
      mbuf_remove(&nc->recv_mbuf,2);
    }
    iVar1 = mg_parse_dns((nc->recv_mbuf).buf,(int)(nc->recv_mbuf).len,(mg_dns_message *)local_c48);
    if (iVar1 == -1) {
      memset(local_c48,0,0xc20);
      msg.pkt.len._0_2_ = 0x8081;
      mg_dns_insert_header((mbuf *)msg.answers[0x1f].rdata.len,0,(mg_dns_message *)local_c48);
      if ((nc->flags & 2) == 0) {
        local_c4a = htons((uint16_t)*(undefined8 *)(msg.answers[0x1f].rdata.len + 8));
        mbuf_insert((mbuf *)msg.answers[0x1f].rdata.len,0,&local_c4a,2);
      }
      mg_send(nc,*(void **)msg.answers[0x1f].rdata.len,
              (int)*(undefined8 *)(msg.answers[0x1f].rdata.len + 8));
    }
    else {
      (*nc->handler)(nc,100,local_c48);
    }
    mbuf_remove((mbuf *)msg.answers[0x1f].rdata.len,*(size_t *)(msg.answers[0x1f].rdata.len + 8));
  }
  return;
}

Assistant:

static void dns_handler(struct mg_connection *nc, int ev, void *ev_data) {
    struct mbuf *io = &nc->recv_mbuf;
    struct mg_dns_message msg;

    /* Pass low-level events to the user handler */
    nc->handler(nc, ev, ev_data);

    switch (ev) {
        case MG_EV_RECV:
            if (!(nc->flags & MG_F_UDP)) {
                mbuf_remove(&nc->recv_mbuf, 2);
            }
            if (mg_parse_dns(nc->recv_mbuf.buf, nc->recv_mbuf.len, &msg) == -1) {
                /* reply + recursion allowed + format error */
                memset(&msg, 0, sizeof(msg));
                msg.flags = 0x8081;
                mg_dns_insert_header(io, 0, &msg);
                if (!(nc->flags & MG_F_UDP)) {
                    uint16_t len = htons(io->len);
                    mbuf_insert(io, 0, &len, 2);
                }
                mg_send(nc, io->buf, io->len);
            } else {
                /* Call user handler with parsed message */
                nc->handler(nc, MG_DNS_MESSAGE, &msg);
            }
            mbuf_remove(io, io->len);
            break;
    }
}